

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::RightShiftFun::GetFunctions(void)

{
  LogicalTypeId LVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunction *function;
  long lVar3;
  pointer function_00;
  ScalarFunctionSet *in_RDI;
  LogicalType *other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb5c;
  FunctionNullHandling in_stack_fffffffffffffb68;
  allocator_type local_491;
  code *in_stack_fffffffffffffb70;
  scalar_function_t local_468;
  _func_int **local_448;
  vector<duckdb::ScalarFunction,_true> *local_440;
  LogicalType *local_438;
  LogicalType local_430 [2];
  LogicalType *local_400;
  LogicalType *local_3f8;
  _Any_data local_3e8;
  code *local_3d8;
  undefined8 uStack_3d0;
  LogicalType local_3c0;
  vector<duckdb::LogicalType,_true> local_3a8;
  LogicalType local_390;
  vector<duckdb::LogicalType,_true> local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Integral();
  local_438 = local_3f8;
  if (local_400 != local_3f8) {
    local_440 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_448 = (_func_int **)&PTR__ScalarFunction_02432a00;
    other = local_400;
    do {
      LogicalType::LogicalType(local_430,other);
      LogicalType::LogicalType(local_430 + 1,other);
      __l._M_len = 2;
      __l._M_array = local_430;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_378,__l
                 ,&local_491);
      LogicalType::LogicalType(&local_390,other);
      LVar1 = other->id_;
      local_3d8 = (code *)0x0;
      uStack_3d0 = 0;
      local_3e8._M_unused._M_object = (void *)0x0;
      local_3e8._8_8_ = 0;
      if (LVar1 < UTINYINT) {
        switch(LVar1) {
        case TINYINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<signed_char,signed_char,signed_char,duckdb::BitwiseShiftRightOperator>
          ;
          break;
        case SMALLINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::BinaryFunction<short,short,short,duckdb::BitwiseShiftRightOperator>;
          break;
        case INTEGER:
          in_stack_fffffffffffffb70 =
               ScalarFunction::BinaryFunction<int,int,int,duckdb::BitwiseShiftRightOperator>;
          break;
        case BIGINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::BinaryFunction<long,long,long,duckdb::BitwiseShiftRightOperator>;
          break;
        default:
switchD_01ade761_default:
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffb70,
                     "Unimplemented type for GetScalarIntegerBinaryFunction","");
          NotImplementedException::NotImplementedException(this,(string *)&stack0xfffffffffffffb70);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        switch(LVar1) {
        case UTINYINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::BitwiseShiftRightOperator>
          ;
          break;
        case USMALLINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::BitwiseShiftRightOperator>
          ;
          break;
        case UINTEGER:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::BitwiseShiftRightOperator>
          ;
          break;
        case UBIGINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::BitwiseShiftRightOperator>
          ;
          break;
        default:
          if (LVar1 == UHUGEINT) {
            in_stack_fffffffffffffb70 =
                 ScalarFunction::
                 BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitwiseShiftRightOperator>
            ;
          }
          else {
            if (LVar1 != HUGEINT) goto switchD_01ade761_default;
            in_stack_fffffffffffffb70 =
                 ScalarFunction::
                 BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitwiseShiftRightOperator>
            ;
          }
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_3e8._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)
                 &stack0xfffffffffffffb70);
      LogicalType::LogicalType(&local_348,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_348;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffb54;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffb5c;
      ScalarFunction::ScalarFunction
                (&local_208,&local_378,&local_390,(scalar_function_t *)&local_3e8,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
                 in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_440->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_448;
      if (local_208.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_208.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_348);
      if (local_3d8 != (code *)0x0) {
        (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_390);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_378);
      lVar3 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_430[0].id_ + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      other = other + 1;
    } while (other != local_438);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_400);
  LogicalType::LogicalType(local_430,BIT);
  LogicalType::LogicalType(local_430 + 1,INTEGER);
  __l_00._M_len = 2;
  __l_00._M_array = local_430;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8,__l_00,
             (allocator_type *)&stack0xfffffffffffffb70);
  LogicalType::LogicalType(&local_3c0,BIT);
  local_468.super__Function_base._M_functor._8_8_ = 0;
  local_468.super__Function_base._M_functor._M_unused._M_object = BitwiseShiftRightOperation;
  local_468._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_468.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_360,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_360;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffb54;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffb5c;
  ScalarFunction::ScalarFunction
            (&local_330,&local_3a8,&local_3c0,&local_468,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_360);
  if (local_468.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_468.super__Function_base._M_manager)
              ((_Any_data *)&local_468,(_Any_data *)&local_468,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_430[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar2) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar2);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet RightShiftFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(
		    ScalarFunction({type, type}, type, GetScalarIntegerBinaryFunction<BitwiseShiftRightOperator>(type)));
	}
	functions.AddFunction(
	    ScalarFunction({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::BIT, BitwiseShiftRightOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}